

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlFreeID(xmlIDPtr id)

{
  int iVar1;
  xmlDictPtr local_18;
  xmlDictPtr dict;
  xmlIDPtr id_local;
  
  local_18 = (xmlDictPtr)0x0;
  if (id != (xmlIDPtr)0x0) {
    if (id->doc != (_xmlDoc *)0x0) {
      local_18 = id->doc->dict;
    }
    if (((id->value != (xmlChar *)0x0) && (id->value != (xmlChar *)0x0)) &&
       ((local_18 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(local_18,id->value), iVar1 == 0)))) {
      (*xmlFree)(id->value);
    }
    if (((id->name != (xmlChar *)0x0) && (id->name != (xmlChar *)0x0)) &&
       ((local_18 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(local_18,id->name), iVar1 == 0)))) {
      (*xmlFree)(id->name);
    }
    if (id->attr != (xmlAttrPtr)0x0) {
      id->attr->id = (_xmlID *)0x0;
      id->attr->atype = 0;
    }
    (*xmlFree)(id);
  }
  return;
}

Assistant:

static void
xmlFreeID(xmlIDPtr id) {
    xmlDictPtr dict = NULL;

    if (id == NULL) return;

    if (id->doc != NULL)
        dict = id->doc->dict;

    if (id->value != NULL)
	DICT_FREE(id->value)
    if (id->name != NULL)
	DICT_FREE(id->name)
    if (id->attr != NULL) {
        id->attr->id = NULL;
        id->attr->atype = 0;
    }

    xmlFree(id);
}